

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(ImGuiContext *context)

{
  ImGuiContext *ctx;
  ImGuiWindow **ppIVar1;
  ImGuiViewportP **ppIVar2;
  ImGuiTableTempData *this;
  int local_2c;
  int local_28;
  int i_2;
  int i_1;
  int i;
  ImGuiContext *backup_context;
  ImGuiContext *g;
  ImGuiContext *context_local;
  
  if (((context->IO).Fonts != (ImFontAtlas *)0x0) && ((context->FontAtlasOwnedByContext & 1U) != 0))
  {
    ((context->IO).Fonts)->Locked = false;
    IM_DELETE<ImFontAtlas>((context->IO).Fonts);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  ctx = GImGui;
  if ((context->Initialized & 1U) != 0) {
    if (((context->SettingsLoaded & 1U) != 0) && ((context->IO).IniFilename != (char *)0x0)) {
      SetCurrentContext(context);
      SaveIniSettingsToDisk((context->IO).IniFilename);
      SetCurrentContext(ctx);
    }
    CallContextHooks(context,ImGuiContextHookType_Shutdown);
    for (i_2 = 0; i_2 < (context->Windows).Size; i_2 = i_2 + 1) {
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&context->Windows,i_2);
      IM_DELETE<ImGuiWindow>(*ppIVar1);
    }
    ImVector<ImGuiWindow_*>::clear(&context->Windows);
    ImVector<ImGuiWindow_*>::clear(&context->WindowsFocusOrder);
    ImVector<ImGuiWindow_*>::clear(&context->WindowsTempSortBuffer);
    context->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear(&context->CurrentWindowStack);
    ImGuiStorage::Clear(&context->WindowsById);
    context->NavWindow = (ImGuiWindow *)0x0;
    context->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    context->HoveredWindow = (ImGuiWindow *)0x0;
    context->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    context->ActiveIdWindow = (ImGuiWindow *)0x0;
    context->MovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColorMod>::clear(&context->ColorStack);
    ImVector<ImGuiStyleMod>::clear(&context->StyleVarStack);
    ImVector<ImFont_*>::clear(&context->FontStack);
    ImVector<ImGuiPopupData>::clear(&context->OpenPopupStack);
    ImVector<ImGuiPopupData>::clear(&context->BeginPopupStack);
    for (local_28 = 0; local_28 < (context->Viewports).Size; local_28 = local_28 + 1) {
      ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&context->Viewports,local_28);
      IM_DELETE<ImGuiViewportP>(*ppIVar2);
    }
    ImVector<ImGuiViewportP_*>::clear(&context->Viewports);
    ImPool<ImGuiTabBar>::Clear(&context->TabBars);
    ImVector<ImGuiPtrOrIndex>::clear(&context->CurrentTabBarStack);
    ImVector<ImGuiShrinkWidthItem>::clear(&context->ShrinkWidthBuffer);
    ImPool<ImGuiTable>::Clear(&context->Tables);
    for (local_2c = 0; local_2c < (context->TablesTempDataStack).Size; local_2c = local_2c + 1) {
      this = ImVector<ImGuiTableTempData>::operator[](&context->TablesTempDataStack,local_2c);
      ImGuiTableTempData::~ImGuiTableTempData(this);
    }
    ImVector<ImGuiTableTempData>::clear(&context->TablesTempDataStack);
    ImVector<ImDrawChannel>::clear(&context->DrawChannelsTempMergeBuffer);
    ImVector<char>::clear(&context->ClipboardHandlerData);
    ImVector<unsigned_int>::clear(&context->MenusIdSubmittedThisFrame);
    ImGuiInputTextState::ClearFreeMemory(&context->InputTextState);
    ImChunkStream<ImGuiWindowSettings>::clear(&context->SettingsWindows);
    ImVector<ImGuiSettingsHandler>::clear(&context->SettingsHandlers);
    if (context->LogFile != (ImFileHandle)0x0) {
      if (context->LogFile != _stdout) {
        ImFileClose(context->LogFile);
      }
      context->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear(&context->LogBuffer);
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    for (int i = 0; i < g.Viewports.Size; i++)
        IM_DELETE(g.Viewports[i]);
    g.Viewports.clear();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.Tables.Clear();
    for (int i = 0; i < g.TablesTempDataStack.Size; i++)
        g.TablesTempDataStack[i].~ImGuiTableTempData();
    g.TablesTempDataStack.clear();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}